

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWriter.cpp
# Opt level: O0

void __thiscall
MILBlob::Blob::FileWriter::FileWriter(FileWriter *this,string *filePath,bool truncateFile)

{
  string *psVar1;
  byte bVar2;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  byte local_19;
  string *psStack_18;
  bool truncateFile_local;
  string *filePath_local;
  FileWriter *this_local;
  
  local_19 = truncateFile;
  psStack_18 = filePath;
  filePath_local = (string *)this;
  std::fstream::fstream(this);
  psVar1 = psStack_18;
  anon_unknown.dwarf_5a793::GetWriterMode((bool)(local_19 & 1));
  std::fstream::open((string *)this,(_Ios_Openmode)psVar1);
  bVar2 = std::ios::operator!((ios *)(&this->m_fileStream + *(long *)(*(long *)this + -0x18)));
  psVar1 = psStack_18;
  if ((bVar2 & 1) != 0) {
    std::operator|(_S_bin,_S_out);
    std::fstream::open((string *)this,(_Ios_Openmode)psVar1);
    std::fstream::close();
    psVar1 = psStack_18;
    anon_unknown.dwarf_5a793::GetWriterMode((bool)(local_19 & 1));
    std::fstream::open((string *)this,(_Ios_Openmode)psVar1);
  }
  bVar2 = std::ios::operator!((ios *)(&this->m_fileStream + *(long *)(*(long *)this + -0x18)));
  if ((bVar2 & 1) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_70,"[MIL FileWriter]: Unable to open ",psStack_18);
    std::operator+(&local_50,&local_70," file stream for writing");
    std::runtime_error::runtime_error(this_00,(string *)&local_50);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

FileWriter::FileWriter(const std::string& filePath, bool truncateFile)
{
    m_fileStream.open(filePath, GetWriterMode(truncateFile));
    if (!m_fileStream) {
        // If file does not exists, ios::in does not create one
        // Let's create a file and re-open with required flags
        m_fileStream.open(filePath, std::ofstream::binary | std::ios::out);
        m_fileStream.close();
        m_fileStream.open(filePath, GetWriterMode(truncateFile));
    }
    MILVerifyIsTrue(m_fileStream,
                    std::runtime_error,
                    "[MIL FileWriter]: Unable to open " + filePath + " file stream for writing");
}